

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  BYTE *pBVar1;
  ZSTD_matchState_t *pZVar2;
  seqDef *psVar3;
  bool bVar4;
  undefined8 uVar5;
  seqStore_t *psVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  ulong uVar15;
  int *ip;
  int iVar16;
  int *piVar17;
  int *piVar18;
  U32 UVar19;
  U32 UVar20;
  int iVar21;
  U32 UVar22;
  U32 UVar23;
  int iVar24;
  long lVar25;
  size_t offset2;
  BYTE *litLimit_w;
  int *local_f0;
  int *local_e8;
  size_t local_e0;
  size_t local_d0;
  U32 local_c4;
  seqStore_t *local_c0;
  BYTE *local_b8;
  BYTE *local_b0;
  ulong local_a8;
  int *local_a0;
  BYTE *local_98;
  BYTE *local_90;
  int *local_88;
  uint local_7c;
  BYTE *local_78;
  ZSTD_matchState_t *local_70;
  U32 *local_68;
  BYTE *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  local_88 = (int *)((long)src + (srcSize - 8));
  pBVar11 = (ms->window).base;
  uVar7 = (ms->window).dictLimit;
  uVar15 = (ulong)uVar7;
  local_b8 = pBVar11 + uVar15;
  UVar23 = *rep;
  pZVar2 = ms->dictMatchState;
  local_90 = (pZVar2->window).nextSrc;
  local_78 = (pZVar2->window).base;
  local_60 = local_78 + (pZVar2->window).dictLimit;
  iVar16 = (int)local_90;
  UVar20 = rep[1];
  piVar17 = (int *)((ulong)(((int)src - ((int)local_60 + (int)local_b8)) + iVar16 == 0) + (long)src)
  ;
  local_f0 = (int *)src;
  local_68 = rep;
  if (piVar17 < local_88) {
    local_7c = ((int)local_78 - iVar16) + uVar7;
    local_98 = local_78 + -(ulong)local_7c;
    local_a0 = (int *)(iEnd + -0x20);
    iVar21 = (int)pBVar11;
    local_48 = (ulong)((1 - uVar7) - iVar21);
    local_50 = (ulong)(uint)-iVar21;
    local_58 = (ulong)((((iVar16 - uVar7) - (int)local_78) - iVar21) + 1);
    local_c0 = seqStore;
    local_b0 = pBVar11;
    local_a8 = uVar15;
    local_70 = ms;
    do {
      iVar16 = (int)piVar17;
      uVar7 = ((iVar16 - (int)pBVar11) - UVar23) + 1;
      uVar10 = (uint)uVar15;
      piVar18 = (int *)(pBVar11 + uVar7);
      if (uVar7 < uVar10) {
        piVar18 = (int *)(local_78 + (uVar7 - local_7c));
      }
      local_c4 = UVar20;
      if ((uVar7 - uVar10 < 0xfffffffd) && (*piVar18 == *(int *)((long)piVar17 + 1))) {
        pBVar11 = iEnd;
        if (uVar7 < uVar10) {
          pBVar11 = local_90;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar17 + 5),(BYTE *)(piVar18 + 1),iEnd,pBVar11,local_b8);
        uVar15 = sVar8 + 4;
      }
      else {
        uVar15 = 0;
      }
      local_d0 = 999999999;
      sVar9 = ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS
                        (local_70,(BYTE *)piVar17,iEnd,&local_d0);
      sVar8 = uVar15;
      if (uVar15 < sVar9) {
        sVar8 = sVar9;
      }
      if (sVar8 < 4) {
        piVar17 = (int *)((long)piVar17 + ((long)piVar17 - (long)local_f0 >> 8) + 1);
        uVar15 = local_a8;
        pBVar11 = local_b0;
        UVar20 = local_c4;
      }
      else {
        local_e8 = piVar17;
        local_e0 = local_d0;
        if (sVar9 <= uVar15) {
          local_e0 = 0;
          local_e8 = (int *)((long)piVar17 + 1);
        }
        local_38 = (ulong)(((int)local_48 + iVar16) - UVar23);
        local_40 = (ulong)(((int)local_50 + iVar16) - UVar23);
        iVar21 = (int)local_58;
        lVar25 = 0;
        do {
          if (local_88 <= (int *)(lVar25 + (long)piVar17)) break;
          ip = (int *)((long)piVar17 + lVar25 + 1);
          iVar24 = (int)lVar25;
          uVar7 = (int)local_40 + iVar24 + 1;
          piVar18 = (int *)(local_b0 + uVar7);
          if (uVar7 < (uint)local_a8) {
            piVar18 = (int *)(local_78 + (iVar24 + ((iVar21 + iVar16) - UVar23)));
          }
          if (((uint)((int)local_38 + iVar24) < 0xfffffffd) && (*piVar18 == *ip)) {
            pBVar11 = iEnd;
            if (uVar7 < (uint)local_a8) {
              pBVar11 = local_90;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)((long)piVar17 + lVar25 + 5),(BYTE *)(piVar18 + 1),iEnd,
                               pBVar11,local_b8);
            if (sVar9 < 0xfffffffffffffffc) {
              uVar10 = (int)local_e0 + 1;
              uVar7 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              if ((int)((uVar7 ^ 0x1f) + (int)sVar8 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                local_e0 = 0;
                sVar8 = sVar9 + 4;
                local_e8 = ip;
              }
            }
          }
          local_d0 = 999999999;
          sVar9 = ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS
                            (local_70,(BYTE *)ip,iEnd,&local_d0);
          bVar4 = true;
          if (3 < sVar9) {
            uVar10 = (int)local_e0 + 1;
            uVar7 = 0x1f;
            if (uVar10 != 0) {
              for (; uVar10 >> uVar7 == 0; uVar7 = uVar7 - 1) {
              }
            }
            uVar10 = (int)local_d0 + 1;
            iVar24 = 0x1f;
            if (uVar10 != 0) {
              for (; uVar10 >> iVar24 == 0; iVar24 = iVar24 + -1) {
              }
            }
            if ((int)((uVar7 ^ 0x1f) + (int)sVar8 * 4 + -0x1b) < (int)sVar9 * 4 - iVar24) {
              bVar4 = false;
              local_e0 = local_d0;
              sVar8 = sVar9;
              local_e8 = ip;
            }
          }
          lVar25 = lVar25 + 1;
        } while (!bVar4);
        pBVar11 = local_b0;
        psVar6 = local_c0;
        if (local_e0 == 0) {
          UVar19 = 1;
          UVar22 = UVar23;
          UVar20 = local_c4;
        }
        else {
          pBVar12 = (BYTE *)((long)local_e8 + (-0xfffffffe - (long)(local_b0 + local_e0)));
          pBVar13 = local_b0;
          pBVar14 = local_b8;
          if ((uint)pBVar12 < (uint)local_a8) {
            pBVar13 = local_98;
            pBVar14 = local_60;
          }
          if ((local_f0 < local_e8) &&
             (uVar15 = (ulong)pBVar12 & 0xffffffff, pBVar14 < pBVar13 + uVar15)) {
            pBVar13 = pBVar13 + uVar15;
            do {
              pBVar13 = pBVar13 + -1;
              piVar17 = (int *)((long)local_e8 + -1);
              if ((*(BYTE *)piVar17 != *pBVar13) ||
                 (sVar8 = sVar8 + 1, local_e8 = piVar17, piVar17 <= local_f0)) break;
            } while (pBVar14 < pBVar13);
          }
          UVar19 = (int)local_e0 + 1;
          UVar22 = (int)local_e0 - 2;
          UVar20 = UVar23;
        }
        uVar15 = (long)local_e8 - (long)local_f0;
        if (local_a0 < local_e8) {
          pBVar13 = local_c0->lit;
          pBVar14 = pBVar13;
          piVar17 = local_f0;
          if (local_f0 <= local_a0) {
            pBVar14 = pBVar13 + ((long)local_a0 - (long)local_f0);
            uVar5 = *(undefined8 *)(local_f0 + 2);
            *(undefined8 *)pBVar13 = *(undefined8 *)local_f0;
            *(undefined8 *)(pBVar13 + 8) = uVar5;
            piVar17 = local_a0;
            if (0x10 < (long)local_a0 - (long)local_f0) {
              lVar25 = 0x10;
              do {
                uVar5 = *(undefined8 *)((BYTE *)((long)local_f0 + lVar25) + 8);
                pBVar12 = pBVar13 + lVar25;
                *(undefined8 *)pBVar12 = *(undefined8 *)((long)local_f0 + lVar25);
                *(undefined8 *)(pBVar12 + 8) = uVar5;
                pBVar1 = (BYTE *)((long)local_f0 + lVar25 + 0x10);
                uVar5 = *(undefined8 *)(pBVar1 + 8);
                *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)pBVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar5;
                lVar25 = lVar25 + 0x20;
              } while (pBVar12 + 0x20 < pBVar14);
            }
          }
          if (piVar17 < local_e8) {
            lVar25 = 0;
            do {
              pBVar14[lVar25] = *(BYTE *)((long)piVar17 + lVar25);
              lVar25 = lVar25 + 1;
            } while ((long)local_e8 - (long)piVar17 != lVar25);
          }
        }
        else {
          pBVar14 = local_c0->lit;
          uVar5 = *(undefined8 *)(local_f0 + 2);
          *(undefined8 *)pBVar14 = *(undefined8 *)local_f0;
          *(undefined8 *)(pBVar14 + 8) = uVar5;
          if (0x10 < uVar15) {
            pBVar14 = local_c0->lit;
            uVar5 = *(undefined8 *)(local_f0 + 6);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(local_f0 + 4);
            *(undefined8 *)(pBVar14 + 0x18) = uVar5;
            if (0x20 < (long)uVar15) {
              lVar25 = 0;
              do {
                pBVar12 = (BYTE *)((long)local_f0 + lVar25 + 0x20);
                uVar5 = *(undefined8 *)(pBVar12 + 8);
                pBVar13 = pBVar14 + lVar25 + 0x20;
                *(undefined8 *)pBVar13 = *(undefined8 *)pBVar12;
                *(undefined8 *)(pBVar13 + 8) = uVar5;
                pBVar12 = (BYTE *)((long)local_f0 + lVar25 + 0x30);
                uVar5 = *(undefined8 *)(pBVar12 + 8);
                *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)pBVar12;
                *(undefined8 *)(pBVar13 + 0x18) = uVar5;
                lVar25 = lVar25 + 0x20;
              } while (pBVar13 + 0x20 < pBVar14 + uVar15);
            }
          }
        }
        local_c0->lit = local_c0->lit + uVar15;
        if (0xffff < uVar15) {
          local_c0->longLengthType = ZSTD_llt_literalLength;
          local_c0->longLengthPos =
               (U32)((ulong)((long)local_c0->sequences - (long)local_c0->sequencesStart) >> 3);
        }
        psVar3 = local_c0->sequences;
        psVar3->litLength = (U16)uVar15;
        psVar3->offset = UVar19;
        if (0xffff < sVar8 - 3) {
          local_c0->longLengthType = ZSTD_llt_matchLength;
          local_c0->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)local_c0->sequencesStart) >> 3);
        }
        psVar3->matchLength = (U16)(sVar8 - 3);
        local_c0->sequences = psVar3 + 1;
        piVar17 = (int *)((long)local_e8 + sVar8);
        pBVar14 = local_98;
        uVar15 = local_a8;
        local_f0 = piVar17;
        do {
          UVar23 = UVar22;
          if (local_88 < piVar17) break;
          uVar7 = ((int)piVar17 - (int)pBVar11) - UVar20;
          uVar10 = (uint)uVar15;
          pBVar13 = pBVar11;
          if (uVar7 < uVar10) {
            pBVar13 = pBVar14;
          }
          if ((uVar7 - uVar10 < 0xfffffffd) && (*(int *)(pBVar13 + uVar7) == *piVar17)) {
            pBVar14 = iEnd;
            if (uVar7 < uVar10) {
              pBVar14 = local_90;
            }
            sVar8 = ZSTD_count_2segments
                              ((BYTE *)(piVar17 + 1),(BYTE *)((long)(pBVar13 + uVar7) + 4),iEnd,
                               pBVar14,local_b8);
            if (local_f0 <= local_a0) {
              pBVar14 = psVar6->lit;
              uVar5 = *(undefined8 *)(local_f0 + 2);
              *(undefined8 *)pBVar14 = *(undefined8 *)local_f0;
              *(undefined8 *)(pBVar14 + 8) = uVar5;
            }
            psVar3 = psVar6->sequences;
            psVar3->litLength = 0;
            psVar3->offset = 1;
            if (0xffff < sVar8 + 1) {
              psVar6->longLengthType = ZSTD_llt_matchLength;
              psVar6->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)psVar6->sequencesStart) >> 3);
            }
            psVar3->matchLength = (U16)(sVar8 + 1);
            psVar6->sequences = psVar3 + 1;
            piVar17 = (int *)((long)piVar17 + sVar8 + 4);
            bVar4 = true;
            pBVar14 = local_98;
            uVar15 = local_a8;
            UVar22 = UVar20;
            local_f0 = piVar17;
          }
          else {
            bVar4 = false;
            UVar23 = UVar20;
          }
          UVar20 = UVar23;
          UVar23 = UVar22;
        } while (bVar4);
      }
    } while (piVar17 < local_88);
  }
  *local_68 = UVar23;
  local_68[1] = UVar20;
  return (long)iEnd - (long)local_f0;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dedicatedDictSearch);
}